

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

string * __thiscall
gflags::anon_unknown_2::CommandLineFlagParser::ProcessOptionsFromStringLocked
          (string *__return_storage_ptr__,CommandLineFlagParser *this,string *contentdata,
          FlagSettingMode set_mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  _Alloc_hider __pattern;
  char cVar5;
  int iVar6;
  char *pcVar7;
  string *extraout_RAX;
  CommandLineFlag *flag;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  byte *pbVar8;
  string *psVar9;
  undefined4 extraout_var;
  long lVar10;
  undefined4 extraout_var_00;
  string *extraout_RAX_02;
  string *extraout_RAX_03;
  size_t sVar11;
  byte *pbVar12;
  char *pcVar13;
  string line;
  string key;
  string error_message;
  char *value;
  byte *local_d0;
  long local_c8;
  byte local_c0 [16];
  string *local_b0;
  CommandLineFlagParser *local_a8;
  string local_a0;
  undefined1 local_80 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  psVar9 = (string *)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar9;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar13 = (contentdata->_M_dataplus)._M_p;
  if (pcVar13 != (char *)0x0) {
    paVar1 = &local_a0.field_2;
    bVar3 = true;
    bVar4 = false;
    local_b0 = __return_storage_ptr__;
    local_a8 = this;
    local_60 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)psVar9;
    do {
      cVar5 = *pcVar13;
      while ((cVar5 != '\0' && (iVar6 = isspace((int)cVar5), iVar6 != 0))) {
        cVar5 = pcVar13[1];
        pcVar13 = pcVar13 + 1;
      }
      pcVar7 = strchr(pcVar13,0xd);
      if ((pcVar7 == (char *)0x0) && (pcVar7 = strchr(pcVar13,10), pcVar7 == (char *)0x0)) {
        sVar11 = strlen(pcVar13);
        pcVar7 = (char *)0x0;
      }
      else {
        sVar11 = (long)pcVar7 - (long)pcVar13;
      }
      local_d0 = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar13,pcVar13 + sVar11);
      psVar9 = extraout_RAX;
      if (local_c8 != 0) {
        bVar2 = *local_d0;
        psVar9 = (string *)(ulong)bVar2;
        if (bVar2 != 0x23) {
          if (bVar2 == 0x2d) {
            if (bVar3) {
              pbVar12 = local_d0 + 1;
              if (local_d0[1] == 0x2d) {
                pbVar12 = local_d0 + 2;
              }
              local_a0._M_string_length = 0;
              local_a0.field_2._M_local_buf[0] = '\0';
              local_80._0_8_ = local_80 + 0x10;
              local_80._8_8_ = 0;
              local_80[0x10] = '\0';
              local_a0._M_dataplus._M_p = (pointer)paVar1;
              flag = FlagRegistry::SplitArgumentLocked
                               (local_a8->registry_,(char *)pbVar12,&local_a0,(char **)&local_58,
                                (string *)local_80);
              if (local_58 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0 && flag != (CommandLineFlag *)0x0) {
                (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
                          (&local_50,local_a8,flag,local_58->_M_local_buf,set_mode);
                std::__cxx11::string::_M_append((char *)local_b0,(ulong)local_50._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p);
                }
              }
              psVar9 = (string *)(local_80 + 0x10);
              if ((string *)local_80._0_8_ != psVar9) {
                operator_delete((void *)local_80._0_8_);
                psVar9 = extraout_RAX_00;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != paVar1) {
                operator_delete(local_a0._M_dataplus._M_p);
                psVar9 = extraout_RAX_01;
              }
              bVar4 = false;
            }
            else {
              bVar4 = false;
            }
          }
          else {
            if (!bVar4) {
              bVar3 = false;
            }
            bVar4 = true;
            pbVar12 = local_d0;
            while ((bVar2 != 0 && (!bVar3))) {
              pbVar8 = (byte *)strchr((char *)pbVar12,0x20);
              if (pbVar8 == (byte *)0x0) {
                sVar11 = strlen((char *)pbVar12);
                pbVar8 = pbVar12 + sVar11;
              }
              local_a0._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,pbVar12,pbVar8);
              psVar9 = (string *)std::__cxx11::string::compare((char *)&local_a0);
              if ((int)psVar9 == 0) {
LAB_00109877:
                bVar3 = true;
              }
              else {
                std::__cxx11::string::rfind(-0x60,0x2f);
                psVar9 = (string *)std::__cxx11::string::compare((char *)&local_a0);
                if ((int)psVar9 == 0) goto LAB_00109877;
                iVar6 = fnmatch(local_a0._M_dataplus._M_p,argv0_abi_cxx11_,1);
                __pattern._M_p = local_a0._M_dataplus._M_p;
                psVar9 = (string *)CONCAT44(extraout_var,iVar6);
                if (iVar6 == 0) goto LAB_00109877;
                lVar10 = std::__cxx11::string::rfind(-0x60,0x2f);
                pcVar13 = argv0_abi_cxx11_ + lVar10 + 1;
                if (lVar10 == -1) {
                  pcVar13 = argv0_abi_cxx11_;
                }
                iVar6 = fnmatch(__pattern._M_p,pcVar13,1);
                psVar9 = (string *)CONCAT44(extraout_var_00,iVar6);
                if (iVar6 == 0) goto LAB_00109877;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != paVar1) {
                operator_delete(local_a0._M_dataplus._M_p);
                psVar9 = extraout_RAX_02;
              }
              pbVar12 = pbVar8 + 1;
              bVar2 = *pbVar8;
            }
          }
        }
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0);
        psVar9 = extraout_RAX_03;
      }
      pcVar13 = pcVar7 + 1;
    } while (pcVar7 != (char *)0x0);
  }
  return psVar9;
}

Assistant:

string CommandLineFlagParser::ProcessOptionsFromStringLocked(
    const string& contentdata, FlagSettingMode set_mode) {
  string retval;
  const char* flagfile_contents = contentdata.c_str();
  bool flags_are_relevant = true;   // set to false when filenames don't match
  bool in_filename_section = false;

  const char* line_end = flagfile_contents;
  // We read this file a line at a time.
  for (; line_end; flagfile_contents = line_end + 1) {
    while (*flagfile_contents && isspace(*flagfile_contents))
      ++flagfile_contents;
    // Windows uses "\r\n"
    line_end = strchr(flagfile_contents, '\r');
    if (line_end == NULL)
        line_end = strchr(flagfile_contents, '\n');

    size_t len = line_end ? line_end - flagfile_contents
                          : strlen(flagfile_contents);
    string line(flagfile_contents, len);

    // Each line can be one of four things:
    // 1) A comment line -- we skip it
    // 2) An empty line -- we skip it
    // 3) A list of filenames -- starts a new filenames+flags section
    // 4) A --flag=value line -- apply if previous filenames match
    if (line.empty() || line[0] == '#') {
      // comment or empty line; just ignore

    } else if (line[0] == '-') {    // flag
      in_filename_section = false;  // instead, it was a flag-line
      if (!flags_are_relevant)      // skip this flag; applies to someone else
        continue;

      const char* name_and_val = line.c_str() + 1;    // skip the leading -
      if (*name_and_val == '-')
        name_and_val++;                               // skip second - too
      string key;
      const char* value;
      string error_message;
      CommandLineFlag* flag = registry_->SplitArgumentLocked(name_and_val,
                                                             &key, &value,
                                                             &error_message);
      // By API, errors parsing flagfile lines are silently ignored.
      if (flag == NULL) {
        // "WARNING: flagname '" + key + "' not found\n"
      } else if (value == NULL) {
        // "WARNING: flagname '" + key + "' missing a value\n"
      } else {
        retval += ProcessSingleOptionLocked(flag, value, set_mode);
      }

    } else {                        // a filename!
      if (!in_filename_section) {   // start over: assume filenames don't match
        in_filename_section = true;
        flags_are_relevant = false;
      }

      // Split the line up at spaces into glob-patterns
      const char* space = line.c_str();   // just has to be non-NULL
      for (const char* word = line.c_str(); *space; word = space+1) {
        if (flags_are_relevant)     // we can stop as soon as we match
          break;
        space = strchr(word, ' ');
        if (space == NULL)
          space = word + strlen(word);
        const string glob(word, space - word);
        // We try matching both against the full argv0 and basename(argv0)
        if (glob == ProgramInvocationName()       // small optimization
            || glob == ProgramInvocationShortName()
#if defined(HAVE_FNMATCH_H)
            || fnmatch(glob.c_str(), ProgramInvocationName(),      FNM_PATHNAME) == 0
            || fnmatch(glob.c_str(), ProgramInvocationShortName(), FNM_PATHNAME) == 0
#elif defined(HAVE_SHLWAPI_H)
            || PathMatchSpecA(glob.c_str(), ProgramInvocationName())
            || PathMatchSpecA(glob.c_str(), ProgramInvocationShortName())
#endif
            ) {
          flags_are_relevant = true;
        }
      }
    }
  }
  return retval;
}